

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O3

int Abc_ZddCof0(Abc_ZddMan *p,int a,int Var)

{
  Abc_ZddObj *pAVar1;
  Abc_ZddEnt *pAVar2;
  int False;
  int True;
  uint uVar3;
  uint uVar4;
  
  False = a;
  if ((1 < a) && ((int)(*(uint *)(p->pObjs + (uint)a) & 0x7fffffff) <= Var)) {
    pAVar2 = p->pCache;
    uVar4 = a * 0xc00005 + Var * 0x40f1f9 + 0x4f3237;
    p->nCacheLookups = p->nCacheLookups + 1;
    uVar3 = p->nCacheMask & uVar4;
    if ((pAVar2[uVar3].Arg0 != a) ||
       (((pAVar2[uVar3].Arg1 != Var || (pAVar2[uVar3].Arg2 != 7)) ||
        (False = pAVar2[uVar3].Res, pAVar2[uVar3].Res < 0)))) {
      pAVar1 = p->pObjs + (uint)a;
      uVar3 = *(uint *)pAVar1;
      False = Abc_ZddCof0(p,pAVar1->False,Var);
      if ((uVar3 & 0x7fffffff) < (uint)Var) {
        True = Abc_ZddCof0(p,pAVar1->True,Var);
        False = Abc_ZddUniqueCreate(p,*(uint *)pAVar1 & 0x7fffffff,True,False);
      }
      pAVar2 = p->pCache;
      uVar4 = uVar4 & p->nCacheMask;
      pAVar2[uVar4].Arg0 = a;
      pAVar2[uVar4].Arg1 = Var;
      pAVar2[uVar4].Arg2 = 7;
      pAVar2[uVar4].Res = False;
      p->nCacheMisses = p->nCacheMisses + 1;
      if (False < 0) {
        __assert_fail("Res >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                      ,0x82,"int Abc_ZddCacheInsert(Abc_ZddMan *, int, int, int, int)");
      }
    }
  }
  return False;
}

Assistant:

int Abc_ZddCof0( Abc_ZddMan * p, int a, int Var )
{
    Abc_ZddObj * A; 
    int r0, r1, r;
    if ( a < 2 ) return a;
    A = Abc_ZddNode( p, a );
    if ( (int)A->Var > Var )
        return a;
    if ( (r = Abc_ZddCacheLookup(p, a, Var, ABC_ZDD_OPER_COF0)) >= 0 )
        return r;
    if ( (int)A->Var < Var )
        r0 = Abc_ZddCof0( p, A->False, Var ),
        r1 = Abc_ZddCof0( p, A->True, Var ),
        r  = Abc_ZddUniqueCreate( p, A->Var, r1, r0 );
    else
        r = Abc_ZddCof0( p, A->False, Var );
    return Abc_ZddCacheInsert( p, a, Var, ABC_ZDD_OPER_COF0, r );
}